

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_input.c
# Opt level: O2

int streamConv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  int iVar1;
  mpt_named_traits *pmVar2;
  int iVar3;
  mpt_type_t mVar4;
  
  pmVar2 = mpt_input_type_traits();
  if (pmVar2 == (mpt_named_traits *)0x0) {
    mVar4 = 0x100;
  }
  else {
    mVar4 = pmVar2->type;
    if (mVar4 == type) goto LAB_00106fde;
  }
  iVar3 = (int)mVar4;
  if (type != 0x100) {
    if (type == 1) {
      if (ptr == (void *)0x0) {
        return iVar3;
      }
      iVar1 = _mpt_stream_fread((mpt_streaminfo *)(val + 2));
      *(int *)ptr = iVar1;
      return iVar3;
    }
    if (type == 0) {
      if (ptr == (void *)0x0) {
        return iVar3;
      }
      *(char **)ptr = "\x01";
      return iVar3;
    }
    return -3;
  }
LAB_00106fde:
  if (ptr != (void *)0x0) {
    *(mpt_convertable **)ptr = val;
  }
  return 1;
}

Assistant:

static int streamConv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	MPT_STRUCT(streamInput) *srm = (void *) val;
	const MPT_STRUCT(named_traits) *traits = mpt_input_type_traits();
	MPT_TYPE(type) me;
	
	if (!traits) {
		me = MPT_ENUM(TypeMetaPtr);
	}
	else if (type == (me = traits->type)) {
		if (ptr) *((void **) ptr) = &srm->_in;
		return MPT_ENUM(TypeUnixSocket);
	}
	if (!type) {
		static const char fmt[] = { MPT_ENUM(TypeUnixSocket), 0 };
		if (ptr) *((const char **) ptr) = fmt;
		return me;
	}
	if (type == MPT_ENUM(TypeMetaPtr)) {
		if (ptr) *((void **) ptr) = &srm->_in;
		return MPT_ENUM(TypeUnixSocket);
	}
	if (type == MPT_ENUM(TypeUnixSocket)) {
		if (ptr) *((int *) ptr) = _mpt_stream_fread(&srm->data._info);
		return me;
	}
	return MPT_ERROR(BadType);
}